

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O2

int __thiscall Fl_Menu_::find_index(Fl_Menu_ *this,Fl_Menu_Item *item)

{
  Fl_Menu_Item *pFVar1;
  int iVar2;
  int iVar3;
  
  pFVar1 = this->menu_;
  iVar2 = size(this);
  iVar3 = -1;
  if ((this->menu_ <= item) && (item < pFVar1 + iVar2)) {
    iVar3 = (int)(((long)item - (long)this->menu_) / 0x38);
  }
  return iVar3;
}

Assistant:

int Fl_Menu_::find_index(const Fl_Menu_Item *item) const {
  Fl_Menu_Item *max = menu_+size();
  if (item<menu_ || item>=max) return(-1);
  return (int) (item-menu_);
}